

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_klass.cpp
# Opt level: O1

shared_ptr<const_HawkTracer::parser::EventKlassField> __thiscall
HawkTracer::parser::EventKlass::_get_field(EventKlass *this,char *name,bool recursive)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  char in_CL;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  long *plVar7;
  shared_ptr<const_HawkTracer::parser::EventKlassField> sVar8;
  char *local_50 [2];
  char local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  plVar7 = *(long **)(name + 0x28);
  plVar1 = *(long **)(name + 0x30);
  _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT71(in_register_00000011,recursive);
  do {
    if (plVar7 == plVar1) {
LAB_0010d8a3:
      (this->_fields_mtx).super___mutex_base._M_mutex.__align = 0;
      *(undefined8 *)((long)&(this->_fields_mtx).super___mutex_base._M_mutex + 8) = 0;
LAB_0010d8aa:
      sVar8.
      super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var6._M_pi;
      sVar8.
      super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (shared_ptr<const_HawkTracer::parser::EventKlassField>)
             sVar8.
             super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
      ;
    }
    lVar2 = *(long *)*plVar7;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)local_50,lVar2,((long *)*plVar7)[1] + lVar2)
    ;
    pcVar3 = local_50[0];
    iVar5 = strcmp((char *)CONCAT71(in_register_00000011,recursive),local_50[0]);
    _Var6._M_pi = extraout_RDX;
    if (pcVar3 != local_40) {
      operator_delete(pcVar3);
      _Var6._M_pi = extraout_RDX_00;
    }
    lVar2 = *plVar7;
    if (iVar5 == 0) {
      (this->_fields_mtx).super___mutex_base._M_mutex.__align = lVar2;
      lVar2 = plVar7[1];
      *(long *)((long)&(this->_fields_mtx).super___mutex_base._M_mutex + 8) = lVar2;
      if (lVar2 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
        }
      }
LAB_0010d89d:
      if (plVar7 != plVar1) goto LAB_0010d8aa;
      goto LAB_0010d8a3;
    }
    if (*(int *)(lVar2 + 0x50) == 10 && in_CL == '\x01') {
      pcVar3 = *(char **)(lVar2 + 0x40);
      p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar2 + 0x48);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      sVar8 = get_field(this,pcVar3,recursive);
      _Var6 = sVar8.
              super___shared_ptr<const_HawkTracer::parser::EventKlassField,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        _Var6._M_pi = extraout_RDX_01;
      }
      if ((this->_fields_mtx).super___mutex_base._M_mutex.__align != 0) goto LAB_0010d89d;
      p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(this->_fields_mtx).super___mutex_base._M_mutex + 8);
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        _Var6._M_pi = extraout_RDX_02;
      }
    }
    plVar7 = plVar7 + 2;
  } while( true );
}

Assistant:

std::shared_ptr<const EventKlassField> EventKlass::_get_field(const char* name, bool recursive) const
{
    for (const auto& field : _fields)
    {
        if (strcmp(name, field->get_name().c_str()) == 0)
        {
            return field;
        }
        else if (field->get_type_id() == FieldTypeId::STRUCT && recursive)
        {
            auto base_field = field->get_klass()->get_field(name, recursive);
            if (base_field)
            {
                return base_field;
            }
        }
    }

    return nullptr;
}